

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O3

int __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GetFieldOrdinal
          (MessageGenerator *this,FieldDescriptor *descriptor)

{
  pointer pbVar1;
  undefined8 *puVar2;
  size_t __n;
  int iVar3;
  LogMessage *pLVar4;
  size_type *psVar5;
  long lVar6;
  long lVar7;
  LogFinisher local_69;
  LogMessage local_68;
  
  pbVar1 = (this->field_names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(this->field_names_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 5;
    puVar2 = *(undefined8 **)descriptor;
    __n = puVar2[1];
    psVar5 = &pbVar1->_M_string_length;
    lVar7 = 0;
    do {
      if (*psVar5 == __n) {
        if (__n == 0) goto LAB_00268c6d;
        iVar3 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (psVar5 + -1))->_M_dataplus)._M_p,(void *)*puVar2,__n);
        if (iVar3 == 0) goto LAB_00268c6d;
      }
      lVar7 = lVar7 + 1;
      psVar5 = psVar5 + 4;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
  }
  internal::LogMessage::LogMessage
            (&local_68,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/csharp/csharp_message.cc"
             ,0x21b);
  pLVar4 = internal::LogMessage::operator<<(&local_68,"Could not find ordinal for field ");
  pLVar4 = internal::LogMessage::operator<<(pLVar4,*(string **)descriptor);
  internal::LogFinisher::operator=(&local_69,pLVar4);
  internal::LogMessage::~LogMessage(&local_68);
  lVar7 = 0xffffffff;
LAB_00268c6d:
  return (int)lVar7;
}

Assistant:

int MessageGenerator::GetFieldOrdinal(const FieldDescriptor* descriptor) {
  for (int i = 0; i < field_names().size(); i++) {
    if (field_names()[i] == descriptor->name()) {
      return i;
    }
  }
  GOOGLE_LOG(DFATAL)<< "Could not find ordinal for field " << descriptor->name();
  return -1;
}